

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  LogMessage *pLVar7;
  long lVar8;
  char *pcVar9;
  char *in_RCX;
  undefined1 auVar10 [16];
  string_view src;
  char *end;
  int local_90;
  uint32_t unicode;
  int code_1;
  int code;
  char *ptr;
  size_t new_len;
  size_t local_70;
  string local_68;
  LogMessage local_38;
  Voidify local_21;
  long local_20;
  size_t text_size;
  string *output_local;
  string *text_local;
  
  text_size = (size_t)output;
  output_local = text;
  lVar6 = std::__cxx11::string::size();
  local_20 = lVar6;
  if (lVar6 == 0) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x48a);
    pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar7,(char (*) [93])
                               " Tokenizer::ParseStringAppend() passed text that could not have been tokenized as a string: "
                       );
    auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)output_local);
    src._M_len = auVar10._8_8_;
    new_len = auVar10._0_8_;
    src._M_str = in_RCX;
    local_70 = src._M_len;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_68,(lts_20250127 *)new_len,src);
    pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar7);
    std::__cxx11::string::~string((string *)&local_68);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_38);
  }
  else {
    lVar8 = std::__cxx11::string::size();
    ptr = (char *)(lVar6 + lVar8);
    pcVar9 = (char *)std::__cxx11::string::capacity();
    if (pcVar9 < (char *)(lVar6 + lVar8)) {
      std::__cxx11::string::reserve(text_size);
    }
    pcVar9 = (char *)std::__cxx11::string::c_str();
    while (_code_1 = pcVar9 + 1, *_code_1 != '\0') {
      if ((*_code_1 == '\\') && (pcVar9[2] != '\0')) {
        _code_1 = pcVar9 + 2;
        bVar3 = io::anon_unknown_0::OctalDigit::InClass(*_code_1);
        sVar2 = text_size;
        if (bVar3) {
          unicode = io::anon_unknown_0::DigitValue(*_code_1);
          bVar3 = io::anon_unknown_0::OctalDigit::InClass(_code_1[1]);
          if (bVar3) {
            _code_1 = _code_1 + 1;
            iVar5 = unicode * 8;
            iVar4 = io::anon_unknown_0::DigitValue(*_code_1);
            unicode = iVar5 + iVar4;
          }
          bVar3 = io::anon_unknown_0::OctalDigit::InClass(_code_1[1]);
          if (bVar3) {
            _code_1 = _code_1 + 1;
            iVar5 = unicode * 8;
            iVar4 = io::anon_unknown_0::DigitValue(*_code_1);
            unicode = iVar5 + iVar4;
          }
          std::__cxx11::string::push_back((char)text_size);
          pcVar9 = _code_1;
        }
        else if ((*_code_1 == 'x') || (*_code_1 == 'X')) {
          local_90 = 0;
          bVar3 = io::anon_unknown_0::HexDigit::InClass(_code_1[1]);
          if (bVar3) {
            _code_1 = _code_1 + 1;
            local_90 = io::anon_unknown_0::DigitValue(*_code_1);
          }
          bVar3 = io::anon_unknown_0::HexDigit::InClass(_code_1[1]);
          if (bVar3) {
            _code_1 = _code_1 + 1;
            iVar5 = local_90 * 0x10;
            local_90 = io::anon_unknown_0::DigitValue(*_code_1);
            local_90 = iVar5 + local_90;
          }
          std::__cxx11::string::push_back((char)text_size);
          pcVar9 = _code_1;
        }
        else if ((*_code_1 == 'u') || (*_code_1 == 'U')) {
          pcVar9 = FetchUnicodePoint(_code_1,(uint32_t *)((long)&end + 4));
          if (pcVar9 == _code_1) {
            std::__cxx11::string::push_back((char)text_size);
            pcVar9 = _code_1;
          }
          else {
            AppendUTF8(end._4_4_,(string *)text_size);
            pcVar9 = pcVar9 + -1;
          }
        }
        else {
          io::anon_unknown_0::TranslateEscape(*_code_1);
          std::__cxx11::string::push_back((char)sVar2);
          pcVar9 = _code_1;
        }
      }
      else {
        cVar1 = *_code_1;
        pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)output_local);
        if ((cVar1 != *pcVar9) || (pcVar9 = _code_1, _code_1[1] != '\0')) {
          std::__cxx11::string::push_back((char)text_size);
          pcVar9 = _code_1;
        }
      }
    }
  }
  return;
}

Assistant:

void Tokenizer::ParseStringAppend(const std::string& text,
                                  std::string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    ABSL_DLOG(FATAL)
        << " Tokenizer::ParseStringAppend() passed text that could not"
           " have been tokenized as a string: "
        << absl::CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x' || *ptr == 'X') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32_t unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}